

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_manager.c
# Opt level: O1

apx_error_t apx_nodeManager_build_node(apx_nodeManager_t *self,char *definition_text)

{
  apx_mode_t mode;
  apx_error_t aVar1;
  size_t sVar2;
  apx_node_t *self_00;
  char *name;
  apx_nodeInstance_t *self_01;
  
  aVar1 = 1;
  if (definition_text != (char *)0x0 && self != (apx_nodeManager_t *)0x0) {
    sVar2 = strlen(definition_text);
    aVar1 = apx_parser_parse_cstr(&self->parser,definition_text);
    if (aVar1 == 0) {
      self_00 = apx_parser_take_last_node(&self->parser);
      if (self_00 == (apx_node_t *)0x0) {
        __assert_fail("node != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_manager.c"
                      ,0x86,
                      "apx_error_t apx_nodeManager_build_node(apx_nodeManager_t *, const char *)");
      }
      if ((apx_size_t)sVar2 == 0) {
        aVar1 = 1;
      }
      else {
        mode = self->mode;
        name = apx_node_get_name(self_00);
        self_01 = apx_nodeInstance_new(mode,name);
        aVar1 = apx_nodeInstance_init_node_data
                          (self_01,(uint8_t *)definition_text,(apx_size_t)sVar2);
        if (aVar1 == 0) {
          aVar1 = build_node_instance(self,self_01,self_00);
        }
        if (aVar1 == 0) {
          attach_node(self,self_01);
        }
        else {
          apx_nodeInstance_delete(self_01);
        }
      }
      apx_node_delete(self_00);
    }
  }
  return aVar1;
}

Assistant:

apx_error_t apx_nodeManager_build_node(apx_nodeManager_t* self, char const* definition_text)
{
   if ((self != NULL) && (definition_text != NULL))
   {
      size_t definition_size = strlen(definition_text);
      apx_error_t result = apx_parser_parse_cstr(&self->parser, definition_text);
      apx_node_t* node = NULL;
      if (result != APX_NO_ERROR)
      {
         return result;
      }
      node = apx_parser_take_last_node(&self->parser);
      assert(node != NULL);
      result = create_node_instance(self, node, (uint8_t const*)definition_text, (apx_size_t)definition_size);
      apx_node_delete(node);
      return result;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}